

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddMisc.c
# Opt level: O0

void Cudd_zddPrintSubtable(DdManager *table)

{
  DdNode *pDVar1;
  DdSubtable *pDVar2;
  DdNode *pDVar3;
  DdSubtable *ZSubTable;
  DdNode *base;
  DdNode *z1_next;
  DdNode *z1;
  int j;
  int i;
  DdManager *table_local;
  
  pDVar1 = table->one;
  z1._4_4_ = table->sizeZ;
  while (z1._4_4_ = z1._4_4_ - 1, -1 < (int)z1._4_4_) {
    pDVar2 = table->subtableZ;
    printf("subtable[%d]:\n",(ulong)z1._4_4_);
    z1._0_4_ = pDVar2[(int)z1._4_4_].slots;
    while (z1._0_4_ = (uint)z1 - 1, -1 < (int)(uint)z1) {
      for (z1_next = pDVar2[(int)z1._4_4_].nodelist[(int)(uint)z1]; z1_next != (DdNode *)0x0;
          z1_next = z1_next->next) {
        fprintf((FILE *)table->out,"ID = 0x%lx\tindex = %u\tr = %u\t",(ulong)z1_next / 0x28,
                (ulong)z1_next->index,(ulong)z1_next->ref);
        pDVar3 = (z1_next->type).kids.T;
        if (*(int *)((ulong)pDVar3 & 0xfffffffffffffffe) == 0x7fffffff) {
          fprintf((FILE *)table->out,"T = %d\t\t",(ulong)(pDVar3 == pDVar1));
        }
        else {
          fprintf((FILE *)table->out,"T = 0x%lx\t",(ulong)pDVar3 / 0x28);
        }
        pDVar3 = (z1_next->type).kids.E;
        if (*(int *)((ulong)pDVar3 & 0xfffffffffffffffe) == 0x7fffffff) {
          fprintf((FILE *)table->out,"E = %d\n",(ulong)(pDVar3 == pDVar1));
        }
        else {
          fprintf((FILE *)table->out,"E = 0x%lx\n",(ulong)pDVar3 / 0x28);
        }
      }
    }
  }
  putchar(10);
  return;
}

Assistant:

void
Cudd_zddPrintSubtable(
  DdManager * table)
{
    int         i, j;
    DdNode      *z1, *z1_next, *base;
    DdSubtable  *ZSubTable;

    base = table->one;
    for (i = table->sizeZ - 1; i >= 0; i--) {
        ZSubTable = &(table->subtableZ[i]);
        printf("subtable[%d]:\n", i);
        for (j = ZSubTable->slots - 1; j >= 0; j--) {
            z1 = ZSubTable->nodelist[j];
            while (z1 != NIL(DdNode)) {
                (void) fprintf(table->out,
#if SIZEOF_VOID_P == 8
                    "ID = 0x%lx\tindex = %u\tr = %u\t",
                    (ptruint) z1 / (ptruint) sizeof(DdNode),
                    z1->index, z1->ref);
#else
                    "ID = 0x%x\tindex = %hu\tr = %hu\t",
                    (ptruint) z1 / (ptruint) sizeof(DdNode),
                    z1->index, z1->ref);
#endif
                z1_next = cuddT(z1);
                if (Cudd_IsConstant(z1_next)) {
                    (void) fprintf(table->out, "T = %d\t\t",
                        (z1_next == base));
                }
                else {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out, "T = 0x%lx\t",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#else
                    (void) fprintf(table->out, "T = 0x%x\t",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#endif
                }
                z1_next = cuddE(z1);
                if (Cudd_IsConstant(z1_next)) {
                    (void) fprintf(table->out, "E = %d\n",
                        (z1_next == base));
                }
                else {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out, "E = 0x%lx\n",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#else
                    (void) fprintf(table->out, "E = 0x%x\n",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#endif
                }

                z1_next = z1->next;
                z1 = z1_next;
            }
        }
    }
    putchar('\n');

}